

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.h
# Opt level: O1

void __thiscall
Js::StringProfiler::ConcatMetrics::Accumulate(ConcatMetrics *this,ConcatType concatType)

{
  switch(concatType) {
  case ConcatType_Unknown:
    this = (ConcatMetrics *)&this->unknownCount;
    break;
  case ConcatType_CompoundString:
    break;
  case ConcatType_ConcatTree:
    this = (ConcatMetrics *)&this->concatTreeCount;
    break;
  case ConcatType_BufferString:
    this = (ConcatMetrics *)&this->bufferStringBuilderCount;
    break;
  default:
    goto switchD_00d48839_default;
  }
  this->compoundStringCount = this->compoundStringCount + 1;
switchD_00d48839_default:
  return;
}

Assistant:

void Accumulate(ConcatType concatType)
            {
                switch(concatType)
                {
                case ConcatType_CompoundString:
                    this->compoundStringCount++;
                    break;
                case ConcatType_ConcatTree:
                    this->concatTreeCount++;
                    break;
                case ConcatType_BufferString:
                    this->bufferStringBuilderCount++;
                    break;
                case ConcatType_Unknown:
                    this->unknownCount++;
                    break;
                }
            }